

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void DeleteGame(pyhanabi_game_t *game)

{
  long *in_RDI;
  HanabiGame *this;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("game != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x1f6,"void DeleteGame(pyhanabi_game_t *)");
  }
  if (*in_RDI != 0) {
    this = (HanabiGame *)*in_RDI;
    if (this != (HanabiGame *)0x0) {
      hanabi_learning_env::HanabiGame::~HanabiGame(this);
      operator_delete(this);
    }
    *in_RDI = 0;
    return;
  }
  __assert_fail("game->game != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x1f7,"void DeleteGame(pyhanabi_game_t *)");
}

Assistant:

void DeleteGame(pyhanabi_game_t* game) {
  REQUIRE(game != nullptr);
  REQUIRE(game->game != nullptr);
  delete reinterpret_cast<hanabi_learning_env::HanabiGame*>(game->game);
  game->game = nullptr;
}